

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  bool bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  wchar_t *pwVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  wchar_t *pwVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int i_1;
  char *pcVar16;
  ulong uVar17;
  int i;
  int iVar18;
  char *pcVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  
  auVar5 = _DAT_01dd8ba0;
  auVar4 = _DAT_01dd7b40;
  auVar3 = _DAT_01dd7b30;
  uVar8 = this->num_digits_;
  uVar11 = (ulong)uVar8;
  uVar10 = this->exp_;
  uVar15 = (ulong)uVar10;
  uVar6 = uVar10 + uVar8;
  uVar14 = *(uint *)&(this->specs_).field_0x4;
  if ((char)uVar14 == '\x01') {
    pcVar16 = this->digits_;
    *it = (int)*pcVar16;
    uVar10 = (this->specs_).precision - uVar8;
    bVar13 = (byte)((uint)*(undefined4 *)&(this->specs_).field_0x4 >> 0x1d) & 1 & 0 < (int)uVar10;
    if (((int)uVar8 < 2) && (bVar13 == 0)) {
      pwVar7 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar7 = it + 2;
    }
    if (1 < (int)uVar8) {
      lVar9 = uVar11 + 1;
      do {
        pcVar16 = pcVar16 + 1;
        *pwVar7 = (int)*pcVar16;
        pwVar7 = pwVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (2 < lVar9);
    }
    auVar5 = _DAT_01dd8ba0;
    auVar4 = _DAT_01dd7b40;
    auVar3 = _DAT_01dd7b30;
    pwVar12 = pwVar7;
    if (bVar13 != 0) {
      pwVar12 = pwVar7 + uVar10;
      uVar11 = (ulong)uVar10 + 0x3fffffffffffffff;
      uVar15 = uVar11 & 0x3fffffffffffffff;
      auVar20._8_4_ = (int)uVar15;
      auVar20._0_8_ = uVar15;
      auVar20._12_4_ = (int)(uVar15 >> 0x20);
      lVar9 = 0;
      auVar20 = auVar20 ^ _DAT_01dd7b40;
      do {
        auVar29._8_4_ = (int)lVar9;
        auVar29._0_8_ = lVar9;
        auVar29._12_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar34 = (auVar29 | auVar3) ^ auVar4;
        iVar18 = auVar20._4_4_;
        if ((bool)(~(auVar34._4_4_ == iVar18 && auVar20._0_4_ < auVar34._0_4_ ||
                    iVar18 < auVar34._4_4_) & 1)) {
          pwVar7[lVar9] = L'0';
        }
        if ((auVar34._12_4_ != auVar20._12_4_ || auVar34._8_4_ <= auVar20._8_4_) &&
            auVar34._12_4_ <= auVar20._12_4_) {
          pwVar7[lVar9 + 1] = L'0';
        }
        auVar29 = (auVar29 | auVar5) ^ auVar4;
        iVar26 = auVar29._4_4_;
        if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar29._0_4_ <= auVar20._0_4_)) {
          pwVar7[lVar9 + 2] = L'0';
          pwVar7[lVar9 + 3] = L'0';
        }
        lVar9 = lVar9 + 4;
      } while ((uVar15 - ((uint)uVar11 & 3)) + 4 != lVar9);
    }
    *pwVar12 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x18 & 1) == 0) << 5 | 0x45;
    pwVar7 = write_exponent<wchar_t,wchar_t*>(uVar6 - 1,pwVar12 + 1);
    return pwVar7;
  }
  if ((int)uVar10 < 0) {
    if ((int)uVar6 < 1) {
      *it = L'0';
      uVar10 = -uVar6;
      if (uVar8 == 0) {
        uVar14 = (this->specs_).precision;
        uVar2 = uVar10;
        if (SBORROW4(uVar14,uVar10) != (int)(uVar14 + uVar6) < 0) {
          uVar2 = uVar14;
        }
        if (-1 < (int)uVar14) {
          uVar10 = uVar2;
        }
      }
      if (0 < (int)uVar8 && ((this->specs_).field_0x7 & 0x20) == 0) {
        do {
          if (this->digits_[uVar11 - 1] != '0') goto LAB_018386a4;
          bVar1 = 1 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar1);
        uVar11 = 0;
      }
LAB_018386a4:
      if (uVar10 == 0 && (int)uVar11 == 0) {
        pwVar7 = it + 1;
      }
      else {
        pwVar7 = it + 2;
        it[1] = this->decimal_point_;
        auVar5 = _DAT_01dd8ba0;
        auVar4 = _DAT_01dd7b40;
        auVar3 = _DAT_01dd7b30;
        if (0 < (int)uVar10) {
          pwVar7 = pwVar7 + uVar10;
          uVar15 = (ulong)uVar10 + 0x3fffffffffffffff;
          uVar17 = uVar15 & 0x3fffffffffffffff;
          auVar34._8_4_ = (int)uVar17;
          auVar34._0_8_ = uVar17;
          auVar34._12_4_ = (int)(uVar17 >> 0x20);
          lVar9 = 0;
          auVar34 = auVar34 ^ _DAT_01dd7b40;
          do {
            auVar31._8_4_ = (int)lVar9;
            auVar31._0_8_ = lVar9;
            auVar31._12_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar20 = (auVar31 | auVar3) ^ auVar4;
            iVar18 = auVar34._4_4_;
            if ((bool)(~(auVar20._4_4_ == iVar18 && auVar34._0_4_ < auVar20._0_4_ ||
                        iVar18 < auVar20._4_4_) & 1)) {
              it[lVar9 + 2] = L'0';
            }
            if ((auVar20._12_4_ != auVar34._12_4_ || auVar20._8_4_ <= auVar34._8_4_) &&
                auVar20._12_4_ <= auVar34._12_4_) {
              it[lVar9 + 3] = L'0';
            }
            auVar20 = (auVar31 | auVar5) ^ auVar4;
            iVar26 = auVar20._4_4_;
            if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar20._0_4_ <= auVar34._0_4_)) {
              it[lVar9 + 4] = L'0';
              it[lVar9 + 5] = L'0';
            }
            lVar9 = lVar9 + 4;
          } while ((uVar17 - ((uint)uVar15 & 3)) + 4 != lVar9);
        }
        if (0 < (int)uVar11) {
          pcVar16 = this->digits_;
          lVar9 = (uVar11 & 0xffffffff) + 1;
          do {
            *pwVar7 = (int)*pcVar16;
            pcVar16 = pcVar16 + 1;
            pwVar7 = pwVar7 + 1;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
      }
    }
    else {
      if ((int)uVar6 < 4 || (uVar14 & 0xff0000) == 0) {
        pcVar16 = this->digits_;
        lVar9 = (ulong)uVar6 + 1;
        do {
          *it = (int)*pcVar16;
          pcVar16 = pcVar16 + 1;
          it = it + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      else {
        uVar10 = 3;
        if (uVar6 % 3 != 0) {
          uVar10 = uVar6 % 3;
        }
        pcVar16 = this->digits_;
        iVar18 = 0;
        do {
          if (0 < iVar18) {
            *it = (int)(char)(this->specs_).field_0x6;
            it = it + 1;
          }
          pcVar19 = pcVar16 + iVar18;
          lVar9 = (ulong)uVar10 + 1;
          do {
            *it = (int)*pcVar19;
            pcVar19 = pcVar19 + 1;
            it = it + 1;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
          iVar18 = iVar18 + uVar10;
          uVar10 = 3;
        } while (iVar18 < (int)uVar6);
      }
      lVar9 = (long)(int)uVar8;
      if (((this->specs_).field_0x7 & 0x20) == 0) {
        uVar11 = (ulong)uVar6;
        uVar10 = uVar8 - 1;
        if ((int)uVar6 < (int)(uVar8 - 1)) {
          uVar10 = uVar6;
        }
        do {
          if (this->digits_[lVar9 + -1] != '0') {
            uVar10 = (uint)lVar9;
            break;
          }
          lVar9 = lVar9 + -1;
        } while ((long)uVar11 < lVar9);
        if (uVar10 != uVar6) {
          *it = this->decimal_point_;
          it = it + 1;
        }
        lVar9 = (long)(int)uVar10 - uVar11;
        pwVar7 = it;
        if (lVar9 != 0 && (long)uVar11 <= (long)(int)uVar10) {
          pcVar16 = this->digits_ + uVar11;
          lVar9 = lVar9 + 1;
          do {
            *it = (int)*pcVar16;
            pcVar16 = pcVar16 + 1;
            it = it + 1;
            lVar9 = lVar9 + -1;
            pwVar7 = it;
          } while (1 < lVar9);
        }
      }
      else {
        *it = this->decimal_point_;
        pwVar12 = it + 1;
        uVar11 = (ulong)uVar6;
        if (lVar9 - uVar11 != 0 && (long)uVar11 <= lVar9) {
          pcVar16 = this->digits_ + uVar11;
          lVar9 = (lVar9 - uVar11) + 1;
          do {
            *pwVar12 = (int)*pcVar16;
            pcVar16 = pcVar16 + 1;
            pwVar12 = pwVar12 + 1;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        auVar5 = _DAT_01dd8ba0;
        auVar4 = _DAT_01dd7b40;
        auVar3 = _DAT_01dd7b30;
        iVar18 = (this->specs_).precision;
        uVar10 = iVar18 - uVar8;
        pwVar7 = pwVar12;
        if ((uVar10 != 0 && (int)uVar8 <= iVar18) && (uVar10 != 0 && (int)uVar8 <= iVar18)) {
          uVar11 = (ulong)uVar10 + 0x3fffffffffffffff;
          uVar15 = uVar11 & 0x3fffffffffffffff;
          auVar23._8_4_ = (int)uVar15;
          auVar23._0_8_ = uVar15;
          auVar23._12_4_ = (int)(uVar15 >> 0x20);
          lVar9 = 0;
          auVar23 = auVar23 ^ _DAT_01dd7b40;
          do {
            auVar33._8_4_ = (int)lVar9;
            auVar33._0_8_ = lVar9;
            auVar33._12_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar20 = (auVar33 | auVar3) ^ auVar4;
            iVar18 = auVar23._4_4_;
            if ((bool)(~(auVar20._4_4_ == iVar18 && auVar23._0_4_ < auVar20._0_4_ ||
                        iVar18 < auVar20._4_4_) & 1)) {
              pwVar12[lVar9] = L'0';
            }
            if ((auVar20._12_4_ != auVar23._12_4_ || auVar20._8_4_ <= auVar23._8_4_) &&
                auVar20._12_4_ <= auVar23._12_4_) {
              pwVar12[lVar9 + 1] = L'0';
            }
            auVar20 = (auVar33 | auVar5) ^ auVar4;
            iVar26 = auVar20._4_4_;
            if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar20._0_4_ <= auVar23._0_4_)) {
              pwVar12[lVar9 + 2] = L'0';
              pwVar12[lVar9 + 3] = L'0';
            }
            lVar9 = lVar9 + 4;
            pwVar7 = pwVar12 + uVar10;
          } while ((uVar15 - ((uint)uVar11 & 3)) + 4 != lVar9);
        }
      }
    }
  }
  else {
    if ((int)uVar6 < 4 || (uVar14 & 0xff0000) == 0) {
      if (0 < (int)uVar8) {
        pcVar16 = this->digits_;
        lVar9 = uVar11 + 1;
        do {
          *it = (int)*pcVar16;
          pcVar16 = pcVar16 + 1;
          it = it + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      auVar5 = _DAT_01dd8ba0;
      auVar4 = _DAT_01dd7b40;
      auVar3 = _DAT_01dd7b30;
      pwVar12 = it;
      if (uVar15 != 0) {
        uVar11 = uVar15 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar21._8_4_ = (int)uVar11;
        auVar21._0_8_ = uVar11;
        auVar21._12_4_ = (int)(uVar11 >> 0x20);
        lVar9 = 0;
        auVar21 = auVar21 ^ _DAT_01dd7b40;
        do {
          auVar30._8_4_ = (int)lVar9;
          auVar30._0_8_ = lVar9;
          auVar30._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar20 = (auVar30 | auVar3) ^ auVar4;
          iVar18 = auVar21._4_4_;
          if ((bool)(~(auVar20._4_4_ == iVar18 && auVar21._0_4_ < auVar20._0_4_ ||
                      iVar18 < auVar20._4_4_) & 1)) {
            it[lVar9] = L'0';
          }
          if ((auVar20._12_4_ != auVar21._12_4_ || auVar20._8_4_ <= auVar21._8_4_) &&
              auVar20._12_4_ <= auVar21._12_4_) {
            it[lVar9 + 1] = L'0';
          }
          auVar20 = (auVar30 | auVar5) ^ auVar4;
          iVar26 = auVar20._4_4_;
          if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar20._0_4_ <= auVar21._0_4_)) {
            it[lVar9 + 2] = L'0';
            it[lVar9 + 3] = L'0';
          }
          lVar9 = lVar9 + 4;
          pwVar12 = it + uVar15;
        } while ((uVar11 - ((uint)(uVar15 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
    }
    else {
      uVar10 = 3;
      if (uVar6 % 3 != 0) {
        uVar10 = uVar6 % 3;
      }
      pcVar16 = this->digits_;
      iVar18 = 0;
      do {
        if (0 < iVar18) {
          *it = (int)(char)(this->specs_).field_0x6;
          it = it + 1;
        }
        uVar14 = uVar8 - iVar18;
        if (uVar14 == 0 || (int)uVar8 < iVar18) {
          uVar11 = (ulong)uVar10 + 0x3fffffffffffffff;
          uVar15 = uVar11 & 0x3fffffffffffffff;
          auVar25._8_4_ = (int)uVar15;
          auVar25._0_8_ = uVar15;
          auVar25._12_4_ = (int)(uVar15 >> 0x20);
          lVar9 = 0;
          do {
            auVar28._8_4_ = (int)lVar9;
            auVar28._0_8_ = lVar9;
            auVar28._12_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar20 = auVar25 ^ auVar4;
            auVar29 = (auVar28 | auVar3) ^ auVar4;
            iVar26 = auVar20._4_4_;
            if ((bool)(~(iVar26 < auVar29._4_4_ ||
                        auVar20._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar26) & 1)) {
              it[lVar9] = L'0';
            }
            if (auVar29._12_4_ <= auVar20._12_4_ &&
                (auVar29._8_4_ <= auVar20._8_4_ || auVar29._12_4_ != auVar20._12_4_)) {
              it[lVar9 + 1] = L'0';
            }
            auVar29 = (auVar28 | auVar5) ^ auVar4;
            iVar35 = auVar29._4_4_;
            if (iVar35 <= iVar26 && (iVar35 != iVar26 || auVar29._0_4_ <= auVar20._0_4_)) {
              it[lVar9 + 2] = L'0';
              it[lVar9 + 3] = L'0';
            }
            lVar9 = lVar9 + 4;
            pwVar7 = it + uVar10;
          } while ((uVar15 - ((uint)uVar11 & 3)) + 4 != lVar9);
        }
        else {
          uVar2 = uVar14;
          if ((int)uVar10 < (int)uVar14) {
            uVar2 = uVar10;
          }
          if (0 < (int)uVar14) {
            pcVar19 = pcVar16 + iVar18;
            lVar9 = (long)(int)uVar2 + 1;
            do {
              *it = (int)*pcVar19;
              pcVar19 = pcVar19 + 1;
              it = it + 1;
              lVar9 = lVar9 + -1;
            } while (1 < lVar9);
          }
          pwVar7 = it;
          if (((int)uVar14 < (int)uVar10) &&
             (uVar14 = uVar10 - uVar2, uVar14 != 0 && (int)uVar2 <= (int)uVar10)) {
            uVar11 = (ulong)uVar14 + 0x3fffffffffffffff;
            uVar15 = uVar11 & 0x3fffffffffffffff;
            auVar24._8_4_ = (int)uVar15;
            auVar24._0_8_ = uVar15;
            auVar24._12_4_ = (int)(uVar15 >> 0x20);
            auVar24 = auVar24 ^ auVar4;
            lVar9 = 0;
            do {
              auVar27._8_4_ = (int)lVar9;
              auVar27._0_8_ = lVar9;
              auVar27._12_4_ = (int)((ulong)lVar9 >> 0x20);
              auVar20 = (auVar27 | auVar3) ^ auVar4;
              iVar26 = auVar24._4_4_;
              if ((bool)(~(iVar26 < auVar20._4_4_ ||
                          auVar24._0_4_ < auVar20._0_4_ && auVar20._4_4_ == iVar26) & 1)) {
                it[lVar9] = L'0';
              }
              if (auVar20._12_4_ <= auVar24._12_4_ &&
                  (auVar20._8_4_ <= auVar24._8_4_ || auVar20._12_4_ != auVar24._12_4_)) {
                it[lVar9 + 1] = L'0';
              }
              auVar20 = (auVar27 | auVar5) ^ auVar4;
              iVar35 = auVar20._4_4_;
              if (iVar35 <= iVar26 && (iVar35 != iVar26 || auVar20._0_4_ <= auVar24._0_4_)) {
                it[lVar9 + 2] = L'0';
                it[lVar9 + 3] = L'0';
              }
              lVar9 = lVar9 + 4;
              pwVar7 = it + uVar14;
            } while ((uVar15 - ((uint)uVar11 & 3)) + 4 != lVar9);
          }
        }
        it = pwVar7;
        iVar18 = iVar18 + uVar10;
        uVar10 = 3;
        pwVar12 = it;
      } while (iVar18 < (int)uVar6);
    }
    pwVar7 = pwVar12;
    if (((this->specs_).field_0x7 & 0x20) != 0) {
      *pwVar12 = this->decimal_point_;
      auVar5 = _DAT_01dd8ba0;
      auVar4 = _DAT_01dd7b40;
      auVar3 = _DAT_01dd7b30;
      iVar18 = (this->specs_).precision;
      uVar8 = iVar18 - uVar6;
      if (uVar8 == 0 || iVar18 < (int)uVar6) {
        pwVar7 = pwVar12 + 1;
        if ((this->specs_).field_0x4 != '\x02') {
          pwVar12[1] = L'0';
          pwVar7 = pwVar12 + 2;
        }
      }
      else {
        uVar11 = (ulong)uVar8 + 0x3fffffffffffffff;
        uVar15 = uVar11 & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar15;
        auVar22._0_8_ = uVar15;
        auVar22._12_4_ = (int)(uVar15 >> 0x20);
        lVar9 = 0;
        auVar22 = auVar22 ^ _DAT_01dd7b40;
        do {
          auVar32._8_4_ = (int)lVar9;
          auVar32._0_8_ = lVar9;
          auVar32._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar20 = (auVar32 | auVar3) ^ auVar4;
          iVar18 = auVar22._4_4_;
          if ((bool)(~(auVar20._4_4_ == iVar18 && auVar22._0_4_ < auVar20._0_4_ ||
                      iVar18 < auVar20._4_4_) & 1)) {
            pwVar12[lVar9 + 1] = L'0';
          }
          if ((auVar20._12_4_ != auVar22._12_4_ || auVar20._8_4_ <= auVar22._8_4_) &&
              auVar20._12_4_ <= auVar22._12_4_) {
            pwVar12[lVar9 + 2] = L'0';
          }
          auVar20 = (auVar32 | auVar5) ^ auVar4;
          iVar26 = auVar20._4_4_;
          if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar20._0_4_ <= auVar22._0_4_)) {
            pwVar12[lVar9 + 3] = L'0';
            pwVar12[lVar9 + 4] = L'0';
          }
          lVar9 = lVar9 + 4;
          pwVar7 = pwVar12 + 1 + uVar8;
        } while ((uVar15 - ((uint)uVar11 & 3)) + 4 != lVar9);
      }
    }
  }
  return pwVar7;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }